

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::
PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
::PairMatcher(PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
              *this,PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
                    *param_1)

{
  PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
  *param_1_local;
  PairMatcher<iutest::detail::LeMatcher<int>,_iutest::detail::PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>_>
  *this_local;
  
  IMatcher::IMatcher(&this->super_IMatcher,&param_1->super_IMatcher);
  (this->super_IMatcher)._vptr_IMatcher = (_func_int **)&PTR__PairMatcher_003343f0;
  LeMatcher<int>::LeMatcher(&this->m_m1,&param_1->m_m1);
  PropertyMatcher<int_((anonymous_namespace)::X::*)()_const,_iutest::detail::GeMatcher<int>_>::
  PropertyMatcher(&this->m_m2,&param_1->m_m2);
  return;
}

Assistant:

class PairMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    PairMatcher(const T1& m1, const T2& m2) : m_m1(m1), m_m2(m2) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_UNLIKELY( !CheckElem(actual.first, m_m1) )
        {
            return AssertionFailure() << WhichIs();
        }
        if IUTEST_COND_UNLIKELY( !CheckElem(actual.second, m_m2) )
        {
            return AssertionFailure() << WhichIs();
        }
        return AssertionSuccess();
    }